

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::FormatStrSS<std::__cxx11::stringstream,unsigned_int>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               MemorySizeFormatter<unsigned_int> *Arg)

{
  _Setprecision _Var1;
  ostream *poVar2;
  char *pcVar3;
  uint local_2c;
  uint ref_size;
  MemorySizeFormatter<unsigned_int> *Arg_local;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  if (Arg->ref_size == 0) {
    local_2c = Arg->size;
  }
  else {
    local_2c = Arg->ref_size;
  }
  if (local_2c < 0x40000000) {
    if (local_2c < 0x100000) {
      if (local_2c < 0x400) {
        poVar2 = (ostream *)std::ostream::operator<<(ss + 0x10,Arg->size);
        pcVar3 = " Bytes";
        if ((Arg->size & 1) == 1) {
          pcVar3 = " Byte";
        }
        std::operator<<(poVar2,pcVar3);
      }
      else {
        poVar2 = (ostream *)std::ostream::operator<<(ss + 0x10,std::fixed);
        _Var1 = std::setprecision(Arg->precision);
        poVar2 = std::operator<<(poVar2,_Var1);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)Arg->size / 1024.0);
        std::operator<<(poVar2," KB");
      }
    }
    else {
      poVar2 = (ostream *)std::ostream::operator<<(ss + 0x10,std::fixed);
      _Var1 = std::setprecision(Arg->precision);
      poVar2 = std::operator<<(poVar2,_Var1);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)Arg->size / 1048576.0);
      std::operator<<(poVar2," MB");
    }
  }
  else {
    poVar2 = (ostream *)std::ostream::operator<<(ss + 0x10,std::fixed);
    _Var1 = std::setprecision(Arg->precision);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)Arg->size / 1073741824.0);
    std::operator<<(poVar2," GB");
  }
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const MemorySizeFormatter<Type>& Arg)
{
    auto ref_size = Arg.ref_size != 0 ? Arg.ref_size : Arg.size;
    if (ref_size >= (1 << 30))
    {
        ss << std::fixed << std::setprecision(Arg.precision) << static_cast<double>(Arg.size) / double{1 << 30} << " GB";
    }
    else if (ref_size >= (1 << 20))
    {
        ss << std::fixed << std::setprecision(Arg.precision) << static_cast<double>(Arg.size) / double{1 << 20} << " MB";
    }
    else if (ref_size >= (1 << 10))
    {
        ss << std::fixed << std::setprecision(Arg.precision) << static_cast<double>(Arg.size) / double{1 << 10} << " KB";
    }
    else
    {
        ss << Arg.size << (((Arg.size & 0x01) == 0x01) ? " Byte" : " Bytes");
    }
}